

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  pointer pTVar1;
  pointer pTVar2;
  Index i;
  ulong uVar3;
  ResultType local_30;
  
  local_30.types = &(decl->sig).result_types;
  Write(this,&local_30);
  WriteData(this," ",1);
  WriteData(this,(name->_M_dataplus)._M_p,name->_M_string_length);
  WriteData(this,"(",1);
  pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pTVar2 - (long)pTVar1) >> 2) == 0) {
    WriteData(this,"void",4);
  }
  else {
    for (uVar3 = 0; uVar3 < ((ulong)((long)pTVar2 - (long)pTVar1) >> 2 & 0xffffffff);
        uVar3 = uVar3 + 1) {
      if (uVar3 != 0) {
        WriteData(this,", ",2);
        pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      Write(this,(Type)pTVar1[uVar3].enum_);
      pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  WriteData(this,")",1);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(ResultType(decl.sig.result_types), " ", name, "(");
  if (decl.GetNumParams() == 0) {
    Write("void");
  } else {
    for (Index i = 0; i < decl.GetNumParams(); ++i) {
      if (i != 0)
        Write(", ");
      Write(decl.GetParamType(i));
    }
  }
  Write(")");
}